

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void CVmImageLoader::load_resources_from_fp(osfildef *fp,char *fname,CVmHostIfc *hostifc)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  CVmImageLoaderMres_std res_ifc;
  err_frame_t err_cur__;
  CVmImageLoaderMres local_110;
  CVmHostIfc *local_108;
  int local_100;
  uint local_f8 [2];
  undefined8 local_f0;
  void *local_e8;
  __jmp_buf_tag local_e0;
  
  local_100 = (*hostifc->_vptr_CVmHostIfc[10])(hostifc);
  local_110._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_0035f5f0;
  local_108 = hostifc;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_f0 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_f8;
  local_f8[0] = _setjmp(&local_e0);
  if (local_f8[0] == 0) {
    load_resources_from_fp(fp,fname,&local_110);
  }
  uVar1 = local_f0;
  if (local_f8[0] == 1) {
    local_f8[0] = 2;
  }
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar1;
  if ((local_f8[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar2 = local_e8;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_f8[0] & 2) != 0) {
    free(local_e8);
  }
  return;
}

Assistant:

void CVmImageLoader::load_resources_from_fp(osfildef *fp,
                                            const char *fname,
                                            CVmHostIfc *hostifc)
{
    int fileno;

    /* ask the host system to assign a number to the file */
    fileno = hostifc->add_resfile(fname);

    /* set up a resource interface with the file number */
    CVmImageLoaderMres_std res_ifc(fileno, hostifc);

    err_try
    {
        /* load the resources */
        load_resources_from_fp(fp, fname, &res_ifc);
    }